

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

ON_Internal_ExtrudedEdge * __thiscall
ON_SimpleArray<ON_Internal_ExtrudedEdge>::AppendNew(ON_SimpleArray<ON_Internal_ExtrudedEdge> *this)

{
  ON_Internal_ExtrudedEdge *pOVar1;
  int iVar2;
  
  iVar2 = this->m_count;
  if (iVar2 == this->m_capacity) {
    iVar2 = NewCapacity(this);
    Reserve(this,(long)iVar2);
    iVar2 = this->m_count;
  }
  pOVar1 = this->m_a;
  pOVar1[iVar2].m_extruded_vertex[1] = (ON_Internal_ExtrudedVertex *)0x0;
  (pOVar1[iVar2].m_extruded_vertex + 1)[1] = (ON_Internal_ExtrudedVertex *)0x0;
  pOVar1[iVar2].m_copied_edge = (ON_SubDEdge *)0x0;
  (&pOVar1[iVar2].m_copied_edge)[1] = (ON_SubDEdge *)0x0;
  *(undefined8 *)&pOVar1[iVar2].m_side_group_id = 0;
  *(ON_SubDEdge **)(&pOVar1[iVar2].m_side_group_id + 2) = (ON_SubDEdge *)0x0;
  pOVar1 = pOVar1 + iVar2;
  pOVar1->m_initial_edge_tag = Unset;
  *(undefined3 *)&pOVar1->field_0x1 = 0;
  pOVar1->m_initial_vertex_id[0] = 0;
  *(undefined8 *)(pOVar1->m_initial_vertex_id + 1) = 0;
  iVar2 = this->m_count;
  this->m_count = iVar2 + 1;
  return this->m_a + iVar2;
}

Assistant:

T& ON_SimpleArray<T>::AppendNew()
{
  if ( m_count == m_capacity ) 
  {
    int new_capacity = NewCapacity();
    Reserve( new_capacity );
  }
  memset( (void*)(&m_a[m_count]), 0, sizeof(T) );
  return m_a[m_count++];
}